

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::sort_columns(persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               *this)

{
  _Elt_pointer pfVar1;
  _Elt_pointer pfVar2;
  _Iter_comp_iter<greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>_>
  __comp;
  _Elt_pointer pfVar3;
  _Elt_pointer pfVar4;
  _Map_pointer ppfVar5;
  _Elt_pointer pfVar6;
  _Elt_pointer pfVar7;
  _Map_pointer ppfVar8;
  long lVar9;
  ostream *poVar10;
  ulong uVar11;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> local_b0;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> local_90;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> local_70;
  _Deque_iterator<filtration_index_t,_filtration_index_t_&,_filtration_index_t_*> local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sorting ",8);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," columns",8);
  poVar10 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\r",1);
  pfVar1 = (this->columns_to_reduce).
           super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pfVar2 = (this->columns_to_reduce).
           super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pfVar1 != pfVar2) {
    __comp._M_comp.complex =
         (greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
          )this->complex;
    pfVar3 = (this->columns_to_reduce).
             super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
    pfVar4 = (this->columns_to_reduce).
             super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppfVar5 = (this->columns_to_reduce).
              super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    pfVar6 = (this->columns_to_reduce).
             super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    pfVar7 = (this->columns_to_reduce).
             super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
             super__Deque_impl_data._M_finish._M_last;
    ppfVar8 = (this->columns_to_reduce).
              super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    uVar11 = ((long)pfVar4 - (long)pfVar1 >> 3) + ((long)pfVar2 - (long)pfVar6 >> 3) +
             ((((ulong)((long)ppfVar8 - (long)ppfVar5) >> 3) - 1) +
             (ulong)(ppfVar8 == (_Map_pointer)0x0)) * 0x40;
    lVar9 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    local_70._M_cur = pfVar2;
    local_70._M_first = pfVar6;
    local_70._M_last = pfVar7;
    local_70._M_node = ppfVar8;
    local_50._M_cur = pfVar1;
    local_50._M_first = pfVar3;
    local_50._M_last = pfVar4;
    local_50._M_node = ppfVar5;
    std::
    __introsort_loop<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>,long,__gnu_cxx::__ops::_Iter_comp_iter<greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t&>>>
              (&local_50,&local_70,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,__comp);
    local_b0._M_cur = pfVar2;
    local_b0._M_first = pfVar6;
    local_b0._M_last = pfVar7;
    local_b0._M_node = ppfVar8;
    local_90._M_cur = pfVar1;
    local_90._M_first = pfVar3;
    local_90._M_last = pfVar4;
    local_90._M_node = ppfVar5;
    std::
    __final_insertion_sort<std::_Deque_iterator<filtration_index_t,filtration_index_t&,filtration_index_t*>,__gnu_cxx::__ops::_Iter_comp_iter<greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t&>>>
              (&local_90,&local_b0,__comp);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  return;
}

Assistant:

void sort_columns() {
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "sorting " << columns_to_reduce.size() << " columns" << std::flush << "\r";
#endif

#ifdef SORT_COLUMNS_BY_PIVOT
		std_algorithms::sort(
		    columns_to_reduce.begin(), columns_to_reduce.end(),
		    greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t, decltype(complex)>(complex));
#else
		std_algorithms::sort(columns_to_reduce.begin(), columns_to_reduce.end(),
		                     greater_filtration_or_smaller_index<filtration_index_t>());
#endif
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}